

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  TransformerLogLin *pTVar3;
  ImVec2 IVar4;
  bool local_8a;
  bool local_89;
  ImVec2 intersection;
  int intersect;
  ImVec2 local_50;
  ImVec2 P22;
  ImVec2 local_34;
  ImVec2 P21;
  int prim_local;
  ImVec2 *uv_local;
  ImRect *param_2_local;
  ImDrawList *DrawList_local;
  ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
  *this_local;
  
  pTVar3 = this->Transformer;
  P21.x = (float)prim;
  unique0x100003ab = uv;
  _P22 = GetterXsYs<unsigned_char>::operator()(this->Getter1,prim + 1);
  local_34 = TransformerLogLin::operator()(pTVar3,(ImPlotPoint *)&P22);
  pTVar3 = this->Transformer;
  join_0x00001240_0x00001200_ = GetterXsYs<unsigned_char>::operator()(this->Getter2,(int)P21.x + 1);
  local_50 = TransformerLogLin::operator()(pTVar3,(ImPlotPoint *)&intersection.y);
  fVar2 = (this->P11).y;
  pfVar1 = &(this->P12).y;
  if ((fVar2 < *pfVar1 || fVar2 == *pfVar1) || (local_89 = true, local_50.y <= local_34.y)) {
    fVar2 = (this->P12).y;
    pfVar1 = &(this->P11).y;
    local_8a = (*pfVar1 <= fVar2 && fVar2 != *pfVar1) && local_50.y < local_34.y;
    local_89 = local_8a;
  }
  intersection.x = (float)(uint)local_89;
  IVar4 = Intersection(&this->P11,&local_34,&this->P12,&local_50);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *stack0xffffffffffffffd8;
  DrawList->_VtxWritePtr->col = this->Col;
  DrawList->_VtxWritePtr[1].pos = local_34;
  DrawList->_VtxWritePtr[1].uv = *stack0xffffffffffffffd8;
  DrawList->_VtxWritePtr[1].col = this->Col;
  DrawList->_VtxWritePtr[2].pos = IVar4;
  DrawList->_VtxWritePtr[2].uv = *stack0xffffffffffffffd8;
  DrawList->_VtxWritePtr[2].col = this->Col;
  DrawList->_VtxWritePtr[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *stack0xffffffffffffffd8;
  DrawList->_VtxWritePtr[3].col = this->Col;
  DrawList->_VtxWritePtr[4].pos = local_50;
  DrawList->_VtxWritePtr[4].uv = *stack0xffffffffffffffd8;
  DrawList->_VtxWritePtr[4].col = this->Col;
  DrawList->_VtxWritePtr = DrawList->_VtxWritePtr + 5;
  *DrawList->_IdxWritePtr = DrawList->_VtxCurrentIdx;
  DrawList->_IdxWritePtr[1] = DrawList->_VtxCurrentIdx + 1 + (int)intersection.x;
  DrawList->_IdxWritePtr[2] = DrawList->_VtxCurrentIdx + 3;
  DrawList->_IdxWritePtr[3] = DrawList->_VtxCurrentIdx + 1;
  DrawList->_IdxWritePtr[4] = (DrawList->_VtxCurrentIdx + 3) - (int)intersection.x;
  DrawList->_IdxWritePtr[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = DrawList->_IdxWritePtr + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  this->P11 = local_34;
  this->P12 = local_50;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }